

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int read_line(lua_State *L,FILE *f,int chop)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  luaL_Buffer b;
  
  luaL_buffinit(L,&b);
  iVar1 = 0;
  do {
    if ((iVar1 == -1) || (iVar1 == 10)) {
      if (chop == 0 && iVar1 == 10) {
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = '\n';
        b.n = b.n + 1;
      }
      luaL_pushresult(&b);
      if (iVar1 == 10) {
        uVar2 = 1;
      }
      else {
        sVar4 = lua_rawlen(L,-1);
        uVar2 = (uint)(sVar4 != 0);
      }
      return uVar2;
    }
    pcVar3 = luaL_prepbuffsize(&b,0x2000);
    for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
      iVar1 = getc((FILE *)f);
      if ((iVar1 == -1) || (iVar1 == 10)) break;
      pcVar3[lVar5] = (char)iVar1;
    }
    b.n = b.n + lVar5;
  } while( true );
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c = '\0';
  luaL_buffinit(L, &b);
  while (c != EOF && c != '\n') {  /* repeat until end of line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;
    l_unlockfile(f);
    luaL_addsize(&b, i);
  }
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}